

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O3

void __thiscall
bsplib::Rdma::Rdma(Rdma *this,MPI_Comm comm,size_t max_msg_size,size_t small_exch_size,double alpha,
                  double beta,size_t min_n_hp_msg_size,Method method)

{
  int nprocs;
  
  A2A::A2A(&this->m_first_exchange,comm,max_msg_size,small_exch_size,alpha,beta,method);
  A2A::A2A(&this->m_second_exchange,comm,max_msg_size,small_exch_size,alpha,beta,method);
  nprocs = (this->m_first_exchange).m_nprocs;
  this->m_pid = (this->m_first_exchange).m_pid;
  this->m_nprocs = nprocs;
  this->m_min_n_hp_msg_size = min_n_hp_msg_size;
  *(undefined8 *)&(this->m_register)._M_h._M_rehash_policy = 0;
  (this->m_register)._M_h._M_buckets = &(this->m_register)._M_h._M_single_bucket;
  (this->m_register)._M_h._M_bucket_count = 1;
  (this->m_register)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_register)._M_h._M_element_count = 0;
  (this->m_register)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_register)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_register)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_used_slots).
  super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_used_slots).
  super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_used_slots).
  super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_cached_slot = 0xffffffffffffffff;
  (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ActionBuf::ActionBuf(&this->m_send_actions,nprocs);
  ActionBuf::ActionBuf(&this->m_recv_actions,this->m_nprocs);
  Unbuf::Unbuf(&this->m_unbuf,max_msg_size,comm);
  (this->m_recv_push_pop_comm_buf).m_popped_slots.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_recv_push_pop_comm_buf).m_popped_slots.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->m_recv_push_pop_comm_buf).m_pushed_slots.
  super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_recv_push_pop_comm_buf).m_popped_slots.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_recv_push_pop_comm_buf).m_pushed_slots.
  super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_recv_push_pop_comm_buf).m_pushed_slots.
  super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_send_push_pop_comm_buf).m_popped_slots.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_send_push_pop_comm_buf).m_popped_slots.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->m_send_push_pop_comm_buf).m_pushed_slots.
  super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_send_push_pop_comm_buf).m_popped_slots.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_send_push_pop_comm_buf).m_pushed_slots.
  super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_send_push_pop_comm_buf).m_pushed_slots.
  super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

Rdma :: Rdma( MPI_Comm comm, size_t max_msg_size, size_t small_exch_size,
      double alpha, double beta, size_t min_n_hp_msg_size,
      A2A::Method method  )
    : m_first_exchange( comm, max_msg_size, small_exch_size, 
                        alpha, beta, method )
    , m_second_exchange( comm, max_msg_size, small_exch_size,
                        alpha, beta, method )
    , m_pid(m_first_exchange.pid())
    , m_nprocs(m_first_exchange.nprocs())
    , m_min_n_hp_msg_size( min_n_hp_msg_size )
    , m_register()
    , m_used_slots()
    , m_free_slots()
    , m_cached_slot( no_slot() )
    , m_send_actions( m_nprocs )
    , m_recv_actions( m_nprocs )
    , m_unbuf( max_msg_size, comm )
    , m_send_push_pop_comm_buf()
    , m_recv_push_pop_comm_buf()
#ifdef PROFILE
    , m_tictoc( TicToc :: TOTAL )
#endif
{}